

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

token * __thiscall mjs::parser::get_token(token *__return_storage_ptr__,parser *this)

{
  size_t sVar1;
  
  sVar1 = (this->lexer_).text_pos_;
  token::token(__return_storage_ptr__,&this->current_token_);
  lexer::next_token(&this->lexer_);
  check_token(this);
  this->line_break_skipped_ = false;
  this->token_start_ = (uint32_t)sVar1;
  skip_whitespace(this);
  return __return_storage_ptr__;
}

Assistant:

token get_token() {
        const auto old_end = lexer_.text_position();
        auto t = current_token();
        next_token();
        line_break_skipped_ = false;
#ifdef PARSER_DEBUG
        std::wcout << source_extend{source_, token_start_, old_end} << " Consuming token: " << t << "\n";
#endif
        token_start_ = old_end;
        skip_whitespace();
        return t;
    }